

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::glx::GlxRenderContext::GlxRenderContext
          (GlxRenderContext *this,GlxContextFactory *factory,RenderConfig *config)

{
  int width;
  int height;
  int iVar1;
  int iVar2;
  int iVar3;
  int alpha;
  ApiType apiType;
  EventState *eventState;
  GLXContext p_Var4;
  GlxDrawable *pGVar5;
  FunctionLoader local_48;
  GlxFunctionLoader loader;
  DefaultDeleter<tcu::x11::glx::GlxDrawable> local_2d [13];
  RenderConfig *local_20;
  RenderConfig *config_local;
  GlxContextFactory *factory_local;
  GlxRenderContext *this_local;
  
  local_20 = config;
  config_local = (RenderConfig *)factory;
  factory_local = (GlxContextFactory *)this;
  glu::RenderContext::RenderContext(&this->super_RenderContext);
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_011b89d0;
  eventState = GlxContextFactory::getEventState((GlxContextFactory *)config_local);
  GlxDisplay::GlxDisplay(&this->m_glxDisplay,eventState,(char *)0x0);
  chooseVisual(&this->m_glxVisual,&this->m_glxDisplay,local_20);
  (this->m_type).super_ApiType.m_bits = (local_20->type).super_ApiType.m_bits;
  p_Var4 = GlxVisual::createContext
                     (&this->m_glxVisual,(GlxContextFactory *)config_local,&local_20->type,
                      local_20->resetNotificationStrategy);
  this->m_GLXContext = p_Var4;
  pGVar5 = createDrawable(&this->m_glxVisual,local_20);
  de::DefaultDeleter<tcu::x11::glx::GlxDrawable>::DefaultDeleter(local_2d);
  de::details::
  UniquePtr<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>::UniquePtr
            (&this->m_glxDrawable,pGVar5);
  pGVar5 = de::details::
           UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>::
           operator->(&(this->m_glxDrawable).
                       super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                     );
  width = GlxDrawable::getWidth(pGVar5);
  pGVar5 = de::details::
           UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>::
           operator->(&(this->m_glxDrawable).
                       super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                     );
  height = GlxDrawable::getHeight(pGVar5);
  iVar1 = GlxVisual::getAttrib(&this->m_glxVisual,8);
  iVar2 = GlxVisual::getAttrib(&this->m_glxVisual,9);
  iVar3 = GlxVisual::getAttrib(&this->m_glxVisual,10);
  alpha = GlxVisual::getAttrib(&this->m_glxVisual,0xb);
  PixelFormat::PixelFormat((PixelFormat *)&loader,iVar1,iVar2,iVar3,alpha);
  iVar1 = GlxVisual::getAttrib(&this->m_glxVisual,0xc);
  iVar2 = GlxVisual::getAttrib(&this->m_glxVisual,0xd);
  iVar3 = GlxVisual::getAttrib(&this->m_glxVisual,0x186a1);
  RenderTarget::RenderTarget
            (&this->m_renderTarget,width,height,(PixelFormat *)&loader,iVar1,iVar2,iVar3);
  glw::Functions::Functions(&this->m_functions);
  GlxFunctionLoader::GlxFunctionLoader((GlxFunctionLoader *)&local_48);
  (*(this->super_RenderContext)._vptr_RenderContext[8])();
  apiType = glu::ContextType::getAPI(&local_20->type);
  glu::initFunctions(&this->m_functions,&local_48,apiType);
  return;
}

Assistant:

GlxRenderContext::GlxRenderContext (const GlxContextFactory&	factory,
									const RenderConfig&			config)
	: m_glxDisplay		(factory.getEventState(), DE_NULL)
	, m_glxVisual		(chooseVisual(m_glxDisplay, config))
	, m_type			(config.type)
	, m_GLXContext		(m_glxVisual.createContext(factory, config.type, config.resetNotificationStrategy))
	, m_glxDrawable		(createDrawable(m_glxVisual, config))
	, m_renderTarget	(m_glxDrawable->getWidth(), m_glxDrawable->getHeight(),
						 PixelFormat(m_glxVisual.getAttrib(GLX_RED_SIZE),
									 m_glxVisual.getAttrib(GLX_GREEN_SIZE),
									 m_glxVisual.getAttrib(GLX_BLUE_SIZE),
									 m_glxVisual.getAttrib(GLX_ALPHA_SIZE)),
						 m_glxVisual.getAttrib(GLX_DEPTH_SIZE),
						 m_glxVisual.getAttrib(GLX_STENCIL_SIZE),
						 m_glxVisual.getAttrib(GLX_SAMPLES))
{
	const GlxFunctionLoader loader;
	makeCurrent();
	glu::initFunctions(&m_functions, &loader, config.type.getAPI());
}